

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
create_new_data_nodes
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *this,
          data_node_type *old_node,model_node_type *parent,int fanout_tree_depth,
          vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
          *used_fanout_tree_nodes,int start_bucketID,int extra_duplication_factor)

{
  bool bVar1;
  int iVar2;
  int left;
  int iVar3;
  int iVar4;
  int *piVar5;
  LinearModel<int> *this_00;
  data_node_type *pdVar6;
  undefined4 in_ECX;
  long in_RDX;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *in_RSI;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *in_RDI;
  undefined8 in_R8;
  int in_R9D;
  undefined4 in_stack_00000008;
  int i;
  data_node_type *child_node;
  bool keep_right;
  bool keep_left;
  int child_node_repeats;
  uint8_t duplication_factor;
  FTNode *tree_node;
  iterator __end2;
  iterator __begin2;
  vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *__range2;
  int num_reassigned_keys;
  int right_boundary;
  int left_boundary;
  data_node_type *prev_leaf;
  int cur;
  int appending_left_bucketID;
  bool append_mostly_left;
  int appending_right_bucketID;
  bool append_mostly_right;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  uint in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined1 in_stack_ffffffffffffff43;
  ushort uVar7;
  uint in_stack_ffffffffffffff44;
  uint uVar8;
  int local_ac;
  int local_a0;
  undefined1 local_9a;
  byte local_99;
  int local_98;
  byte local_91;
  reference local_90;
  FTNode *local_88;
  __normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
  local_80;
  undefined8 local_78;
  int local_6c;
  int local_68;
  int iVar9;
  data_node_type *tree_node_00;
  int local_58;
  int right;
  int iVar10;
  undefined4 in_stack_ffffffffffffffbc;
  uint uVar11;
  int iVar12;
  int local_38;
  int local_34;
  byte local_2d;
  int local_2c;
  undefined8 local_28;
  undefined4 local_1c;
  long local_18;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false> *local_10;
  
  local_2c = in_R9D;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_2d = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
             ::is_append_mostly_right(in_RSI);
  local_38 = LinearModel<int>::predict((LinearModel<int> *)(local_18 + 0x10),local_10->max_key_);
  iVar12 = 0;
  piVar5 = std::max<int>(&local_38,(int *)&stack0xffffffffffffffc4);
  iVar2 = *(int *)(local_18 + 0x30) + -1;
  piVar5 = std::min<int>(piVar5,(int *)&stack0xffffffffffffffc0);
  local_34 = *piVar5;
  bVar1 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
          is_append_mostly_left(local_10);
  uVar11 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffbc);
  left = LinearModel<int>::predict((LinearModel<int> *)(local_18 + 0x10),local_10->min_key_);
  right = 0;
  piVar5 = std::max<int>((int *)&stack0xffffffffffffffb4,(int *)&stack0xffffffffffffffb0);
  iVar3 = *(int *)(local_18 + 0x30) + -1;
  piVar5 = std::min<int>(piVar5,(int *)&stack0xffffffffffffffac);
  iVar10 = *piVar5;
  local_58 = local_2c;
  pdVar6 = local_10->prev_leaf_;
  local_68 = 0;
  local_6c = 0;
  local_78 = local_28;
  local_80._M_current =
       (FTNode *)
       std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::begin
                 ((vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_> *)
                  CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  local_88 = (FTNode *)
             std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>::end
                       ((vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>
                         *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (__normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    if (!bVar1) break;
    local_90 = __gnu_cxx::
               __normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
               ::operator*(&local_80);
    local_91 = ((char)local_1c - (char)local_90->level) + (char)in_stack_00000008;
    local_98 = 1 << (local_91 & 0x1f);
    uVar8 = in_stack_ffffffffffffff44 & 0xffffff;
    if (((local_2d & 1) != 0) &&
       (uVar8 = in_stack_ffffffffffffff44 & 0xffffff, local_58 <= local_34)) {
      uVar8 = CONCAT13(local_34 < local_58 + local_98,(int3)in_stack_ffffffffffffff44);
    }
    local_99 = (byte)(uVar8 >> 0x18);
    uVar7 = (ushort)uVar8;
    in_stack_ffffffffffffff44 = CONCAT13(local_99,(uint3)uVar7);
    if (((uVar11 & 0x1000000) != 0) &&
       (in_stack_ffffffffffffff44 = CONCAT13(local_99,(uint3)uVar7), local_58 <= iVar10)) {
      in_stack_ffffffffffffff44 = CONCAT13(local_99,CONCAT12(iVar10 < local_58 + local_98,uVar7));
    }
    local_9a = (undefined1)(in_stack_ffffffffffffff44 >> 0x10);
    local_90->num_keys = local_90->num_keys - local_6c;
    local_6c = 0;
    iVar4 = local_90->right_boundary;
    iVar9 = local_68;
    tree_node_00 = pdVar6;
    while( true ) {
      local_68 = iVar4;
      in_stack_ffffffffffffff44 =
           CONCAT22((short)(in_stack_ffffffffffffff44 >> 0x10),
                    (ushort)(byte)in_stack_ffffffffffffff44);
      if (local_68 < local_10->data_capacity_) {
        piVar5 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                 ::get_key(local_10,local_68);
        in_stack_ffffffffffffff44 =
             CONCAT22((short)(in_stack_ffffffffffffff44 >> 0x10),
                      (ushort)(byte)in_stack_ffffffffffffff44);
        if (*piVar5 != 0x7fffffff) {
          this_00 = (LinearModel<int> *)(local_18 + 0x10);
          piVar5 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                   ::get_key(local_10,local_68);
          iVar4 = LinearModel<int>::predict(this_00,*piVar5);
          in_stack_ffffffffffffff44 =
               CONCAT22((short)(in_stack_ffffffffffffff44 >> 0x10),
                        CONCAT11(iVar4 < local_58 + local_98,(char)in_stack_ffffffffffffff44));
        }
      }
      if ((char)(in_stack_ffffffffffffff44 >> 8) == '\0') break;
      local_6c = local_6c + 1;
      local_a0 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                 ::get_next_filled_position
                           (in_RDI,in_stack_ffffffffffffff44,(bool)in_stack_ffffffffffffff43);
      local_a0 = local_a0 + 1;
      piVar5 = std::min<int>(&local_a0,&local_10->data_capacity_);
      iVar4 = *piVar5;
    }
    local_90->num_keys = local_6c + local_90->num_keys;
    in_stack_ffffffffffffff18 = 0;
    in_stack_ffffffffffffff20 = (uint)(local_99 & 1);
    pdVar6 = bulk_load_leaf_node_from_existing
                       ((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                         *)CONCAT44(iVar12,iVar2),(data_node_type *)CONCAT44(uVar11,iVar10),left,
                        right,SUB41((uint)iVar3 >> 0x18,0),(FTNode *)tree_node_00,
                        SUB41((uint)iVar9 >> 0x18,0),SUB41((uint)iVar9 >> 0x10,0),
                        SUB41((uint)iVar9 >> 8,0));
    (pdVar6->super_AlexNode<int,_int>).level_ = *(short *)(local_18 + 10) + 1;
    (pdVar6->super_AlexNode<int,_int>).cost_ = local_90->cost;
    (pdVar6->super_AlexNode<int,_int>).duplication_factor_ = local_91;
    pdVar6->expected_avg_exp_search_iterations_ = local_90->expected_avg_search_iterations;
    pdVar6->expected_avg_shifts_ = local_90->expected_avg_shifts;
    pdVar6->prev_leaf_ = tree_node_00;
    if (tree_node_00 != (data_node_type *)0x0) {
      tree_node_00->next_leaf_ = pdVar6;
    }
    for (local_ac = local_58; local_ac < local_58 + local_98; local_ac = local_ac + 1) {
      *(data_node_type **)(*(long *)(local_18 + 0x38) + (long)local_ac * 8) = pdVar6;
    }
    local_58 = local_98 + local_58;
    __gnu_cxx::
    __normal_iterator<alex::fanout_tree::FTNode_*,_std::vector<alex::fanout_tree::FTNode,_std::allocator<alex::fanout_tree::FTNode>_>_>
    ::operator++(&local_80);
  }
  pdVar6->next_leaf_ = local_10->next_leaf_;
  if (local_10->next_leaf_ != (self_type *)0x0) {
    local_10->next_leaf_->prev_leaf_ = pdVar6;
  }
  return;
}

Assistant:

void create_new_data_nodes(
      const data_node_type* old_node, model_node_type* parent,
      int fanout_tree_depth,
      std::vector<fanout_tree::FTNode>& used_fanout_tree_nodes,
      int start_bucketID = 0, int extra_duplication_factor = 0) {
    bool append_mostly_right = old_node->is_append_mostly_right();
    int appending_right_bucketID = std::min<int>(
        std::max<int>(parent->model_.predict(old_node->max_key_), 0),
        parent->num_children_ - 1);
    bool append_mostly_left = old_node->is_append_mostly_left();
    int appending_left_bucketID = std::min<int>(
        std::max<int>(parent->model_.predict(old_node->min_key_), 0),
        parent->num_children_ - 1);

    // Create the new data nodes
    int cur = start_bucketID;  // first bucket with same child
    data_node_type* prev_leaf =
        old_node->prev_leaf_;  // used for linking the new data nodes
    int left_boundary = 0;
    int right_boundary = 0;
    // Keys may be re-assigned to an adjacent fanout tree node due to off-by-one
    // errors
    int num_reassigned_keys = 0;
    for (fanout_tree::FTNode& tree_node : used_fanout_tree_nodes) {
      left_boundary = right_boundary;
      auto duplication_factor = static_cast<uint8_t>(
          fanout_tree_depth - tree_node.level + extra_duplication_factor);
      int child_node_repeats = 1 << duplication_factor;
      bool keep_left = append_mostly_right && cur <= appending_right_bucketID &&
                       appending_right_bucketID < cur + child_node_repeats;
      bool keep_right = append_mostly_left && cur <= appending_left_bucketID &&
                        appending_left_bucketID < cur + child_node_repeats;
      right_boundary = tree_node.right_boundary;
      // Account for off-by-one errors due to floating-point precision issues.
      tree_node.num_keys -= num_reassigned_keys;
      num_reassigned_keys = 0;
      while (right_boundary < old_node->data_capacity_ &&
             old_node->get_key(right_boundary) !=
                 data_node_type::kEndSentinel_ &&
             parent->model_.predict(old_node->get_key(right_boundary)) <
                 cur + child_node_repeats) {
        num_reassigned_keys++;
        right_boundary = std::min(
            old_node->get_next_filled_position(right_boundary, false) + 1,
            old_node->data_capacity_);
      }
      tree_node.num_keys += num_reassigned_keys;
      data_node_type* child_node = bulk_load_leaf_node_from_existing(
          old_node, left_boundary, right_boundary, false, &tree_node, false,
          keep_left, keep_right);
      child_node->level_ = static_cast<short>(parent->level_ + 1);
      child_node->cost_ = tree_node.cost;
      child_node->duplication_factor_ = duplication_factor;
      child_node->expected_avg_exp_search_iterations_ =
          tree_node.expected_avg_search_iterations;
      child_node->expected_avg_shifts_ = tree_node.expected_avg_shifts;
      child_node->prev_leaf_ = prev_leaf;
      if (prev_leaf != nullptr) {
        prev_leaf->next_leaf_ = child_node;
      }
      for (int i = cur; i < cur + child_node_repeats; i++) {
        parent->children_[i] = child_node;
      }
      cur += child_node_repeats;
      prev_leaf = child_node;
    }
    prev_leaf->next_leaf_ = old_node->next_leaf_;
    if (old_node->next_leaf_ != nullptr) {
      old_node->next_leaf_->prev_leaf_ = prev_leaf;
    }
  }